

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

GLuint deqp::gls::LifetimeTests::details::getFboAttachment
                 (Functions *gl,GLuint fbo,GLenum requiredType)

{
  GLenum GVar1;
  deBool dVar2;
  GLuint local_28;
  GLint local_24;
  GLint name;
  GLint type;
  GLenum requiredType_local;
  GLuint fbo_local;
  Functions *gl_local;
  
  local_24 = 0;
  local_28 = 0;
  name = requiredType;
  type = fbo;
  _requiredType_local = gl;
  (*gl->bindFramebuffer)(0x8d40,fbo);
  do {
    (*_requiredType_local->getFramebufferAttachmentParameteriv)(0x8d40,0x8ce0,0x8cd0,&local_24);
    GVar1 = (*_requiredType_local->getError)();
    glu::checkError(GVar1,
                    "gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &type)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x100);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if ((local_24 == name) && (local_24 != 0)) {
    do {
      (*_requiredType_local->getFramebufferAttachmentParameteriv)
                (0x8d40,0x8ce0,0x8cd1,(GLint *)&local_28);
      GVar1 = (*_requiredType_local->getError)();
      glu::checkError(GVar1,
                      "gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &name)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                      ,0x109);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    (*_requiredType_local->bindFramebuffer)(0x8d40,0);
    GVar1 = (*_requiredType_local->getError)();
    glu::checkError(GVar1,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x10b);
    gl_local._4_4_ = local_28;
  }
  else {
    gl_local._4_4_ = 0;
  }
  return gl_local._4_4_;
}

Assistant:

GLuint getFboAttachment (const Functions& gl, GLuint fbo, GLenum requiredType)
{
	GLint type = 0, name = 0;
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_CHECK_CALL_ERROR(
		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
											   GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &type),
		gl.getError());

	if (GLenum(type) != requiredType || GLenum(type) == GL_NONE)
		return 0;

	GLU_CHECK_CALL_ERROR(
		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
											   GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,
											   &name),
		gl.getError());
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());

	return name;
}